

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O1

bool __thiscall
Jupiter::Database::create_database(Database *this,string_view file,DataBuffer *header)

{
  char *__filename;
  FILE *file_00;
  
  __filename = (char *)operator_new__((ulong)((long)&this->_vptr_Database + 1));
  memcpy(__filename,(void *)file._M_len,(size_t)this);
  __filename[(long)this] = '\0';
  file_00 = fopen(__filename,"wb");
  Data::create_database((FILE *)file_00,(DataBuffer *)file._M_str);
  operator_delete__(__filename);
  return true;
}

Assistant:

bool Jupiter::Database::create_database(std::string_view file, const Jupiter::DataBuffer *header)
{
	char *str = new char[file.size() + 1];
	memcpy(str, file.data(), file.size() * sizeof(char));
	str[file.size()] = '\0';
	bool r = Jupiter::Database::create_database(str, header);
	delete[] str;
	return r;
}